

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.hpp
# Opt level: O0

const_iterator * __thiscall
ft::mapBase<int,_float,_ft::less<int>,_ft::allocator<ft::pair<const_int,_float>_>_>::lower_bound
          (const_iterator *__return_storage_ptr__,
          mapBase<int,_float,_ft::less<int>,_ft::allocator<ft::pair<const_int,_float>_>_> *this,
          key_type *k)

{
  bool bVar1;
  const_pointer x;
  less<int> local_51;
  int local_50;
  treeIterator<ft::pair<const_int,_float>,_ft::allocator<ft::treeNode<ft::pair<const_int,_float>_>_>_>
  local_40;
  byte local_21;
  key_type *local_20;
  key_type *k_local;
  mapBase<int,_float,_ft::less<int>,_ft::allocator<ft::pair<const_int,_float>_>_> *this_local;
  const_iterator *it;
  
  local_21 = 0;
  local_20 = k;
  k_local = (key_type *)this;
  this_local = (mapBase<int,_float,_ft::less<int>,_ft::allocator<ft::pair<const_int,_float>_>_> *)
               __return_storage_ptr__;
  treeBase<int,_float,_ft::pair<const_int,_float>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_float>_>_>
  ::begin(__return_storage_ptr__,
          &this->
           super_treeBase<int,_float,_ft::pair<const_int,_float>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_float>_>_>
         );
  do {
    treeBase<int,_float,_ft::pair<const_int,_float>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_float>_>_>
    ::end((const_iterator *)&local_40,
          &this->
           super_treeBase<int,_float,_ft::pair<const_int,_float>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_float>_>_>
         );
    bVar1 = operator!=(&__return_storage_ptr__->
                        super_treeIterator<ft::pair<const_int,_float>,_ft::allocator<ft::treeNode<ft::pair<const_int,_float>_>_>_>
                       ,&local_40);
    constTreeIterator<ft::pair<const_int,_float>,_ft::allocator<ft::treeNode<ft::pair<const_int,_float>_>_>_>
    ::~constTreeIterator
              ((constTreeIterator<ft::pair<const_int,_float>,_ft::allocator<ft::treeNode<ft::pair<const_int,_float>_>_>_>
                *)&local_40);
    if (!bVar1) {
      local_50 = 2;
LAB_0011f457:
      if ((local_21 & 1) == 0) {
        constTreeIterator<ft::pair<const_int,_float>,_ft::allocator<ft::treeNode<ft::pair<const_int,_float>_>_>_>
        ::~constTreeIterator(__return_storage_ptr__);
      }
      if (local_50 != 1) {
        treeBase<int,_float,_ft::pair<const_int,_float>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_float>_>_>
        ::end(__return_storage_ptr__,
              &this->
               super_treeBase<int,_float,_ft::pair<const_int,_float>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_float>_>_>
             );
      }
      return __return_storage_ptr__;
    }
    key_comp(this);
    x = constTreeIterator<ft::pair<const_int,_float>,_ft::allocator<ft::treeNode<ft::pair<const_int,_float>_>_>_>
        ::operator->(__return_storage_ptr__);
    bVar1 = less<int>::operator()(&local_51,&x->first,local_20);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      local_21 = 1;
      local_50 = 1;
      goto LAB_0011f457;
    }
    treeIterator<ft::pair<const_int,_float>,_ft::allocator<ft::treeNode<ft::pair<const_int,_float>_>_>_>
    ::operator++(&__return_storage_ptr__->
                  super_treeIterator<ft::pair<const_int,_float>,_ft::allocator<ft::treeNode<ft::pair<const_int,_float>_>_>_>
                );
  } while( true );
}

Assistant:

const_iterator	lower_bound(key_type const & k) const
	{
		for (const_iterator it = this->begin(); it != this->end(); ++it)
		{
			if (!this->key_comp()(it->first, k)) return it;
		}
		return this->end();
	}